

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O3

void __thiscall
duckdb::TextTreeRenderer::ToStreamInternal(TextTreeRenderer *this,RenderTree *root,ostream *ss)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t iVar4;
  
  iVar4 = root->width;
  uVar1 = (this->config).maximum_render_width;
  uVar2 = (this->config).node_render_width;
  uVar3 = uVar2 * iVar4;
  if (uVar1 <= uVar3 && uVar3 - uVar1 != 0) {
    do {
      uVar2 = uVar2 - 2;
      if (uVar2 < (this->config).minimum_render_width) break;
      (this->config).node_render_width = uVar2;
      uVar3 = uVar3 + iVar4 * -2;
    } while (uVar1 < uVar3);
  }
  if (root->height != 0) {
    iVar4 = 0;
    do {
      RenderTopLayer(this,root,ss,iVar4);
      RenderBoxContent(this,root,ss,iVar4);
      RenderBottomLayer(this,root,ss,iVar4);
      iVar4 = iVar4 + 1;
    } while (iVar4 < root->height);
  }
  return;
}

Assistant:

void TextTreeRenderer::ToStreamInternal(RenderTree &root, std::ostream &ss) {
	while (root.width * config.node_render_width > config.maximum_render_width) {
		if (config.node_render_width - 2 < config.minimum_render_width) {
			break;
		}
		config.node_render_width -= 2;
	}

	for (idx_t y = 0; y < root.height; y++) {
		// start by rendering the top layer
		RenderTopLayer(root, ss, y);
		// now we render the content of the boxes
		RenderBoxContent(root, ss, y);
		// render the bottom layer of each of the boxes
		RenderBottomLayer(root, ss, y);
	}
}